

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O3

url_mapper * __thiscall
cppcms::url_mapper::get_mapper_for_key
          (url_mapper *this,string_key *key,string_key *real_key,
          vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> *keywords)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char *pcVar3;
  string_key *psVar4;
  vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> *this_00;
  bool bVar5;
  size_type sVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  url_mapper *local_b0;
  undefined1 local_a8 [16];
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string_key *local_70;
  vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> *local_68;
  string_key local_60;
  
  pcVar12 = key->begin_;
  pcVar7 = key->end_;
  pcVar8 = (key->key_)._M_dataplus._M_p;
  sVar6 = (key->key_)._M_string_length;
  pcVar11 = pcVar12;
  pcVar3 = pcVar7;
  if (pcVar12 == (char *)0x0) {
    pcVar11 = pcVar8;
    pcVar3 = pcVar8 + sVar6;
  }
  if (pcVar3 == pcVar11) {
    (real_key->key_)._M_string_length = 0;
    real_key->begin_ = (char *)0x0;
    real_key->end_ = (char *)0x0;
    goto LAB_001dcdc6;
  }
  cVar2 = *pcVar11;
  local_b0 = this;
  local_68 = keywords;
  if (cVar2 == '/') {
    local_b0 = topmost(this);
    pcVar12 = key->begin_;
    pcVar7 = key->end_;
    pcVar8 = (key->key_)._M_dataplus._M_p;
    sVar6 = (key->key_)._M_string_length;
  }
  uVar14 = (ulong)(cVar2 == '/');
  if (pcVar12 == (char *)0x0) {
    pcVar12 = pcVar8;
    pcVar7 = pcVar8 + sVar6;
  }
  uVar9 = (long)pcVar7 - (long)pcVar12;
  local_70 = real_key;
  if (uVar14 < uVar9) {
    paVar1 = &local_60.key_.field_2;
    do {
      psVar4 = local_70;
      pcVar8 = pcVar12 + uVar14;
      uVar13 = uVar14;
      do {
        if (pcVar12[uVar13] == '/') break;
        uVar13 = uVar13 + 1;
      } while (uVar13 <= uVar9);
      uVar10 = uVar14;
      if (uVar9 <= uVar13) goto LAB_001dcdea;
      local_60.end_ = pcVar12 + uVar13;
      if ((ulong)((long)pcVar7 - (long)pcVar8) < uVar13 - uVar14) {
        local_60.end_ = pcVar7;
      }
      local_60.key_._M_string_length = 0;
      local_60.key_.field_2._M_local_buf[0] = '\0';
      local_a8._0_8_ = ".";
      local_a8._8_8_ = "";
      local_90 = 0;
      local_88._M_local_buf[0] = '\0';
      local_98._M_p = (pointer)&local_88;
      local_60.begin_ = pcVar8;
      local_60.key_._M_dataplus._M_p = (pointer)paVar1;
      bVar5 = string_key::operator==(&local_60,(string_key *)local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p);
      }
      if (!bVar5) {
        local_a8._0_8_ = "..";
        local_a8._8_8_ = "";
        local_90 = 0;
        local_88._M_local_buf[0] = '\0';
        local_98._M_p = (pointer)&local_88;
        bVar5 = string_key::operator==(&local_60,(string_key *)local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_p != &local_88) {
          operator_delete(local_98._M_p);
        }
        if (bVar5) {
          local_b0 = parent(local_b0);
        }
        else {
          local_b0 = data::child((local_b0->d).ptr_,&local_60,key);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.key_._M_dataplus._M_p != paVar1) {
        operator_delete(local_60.key_._M_dataplus._M_p);
      }
      pcVar12 = key->begin_;
      if (pcVar12 == (char *)0x0) {
        pcVar12 = (key->key_)._M_dataplus._M_p;
        pcVar7 = pcVar12 + (key->key_)._M_string_length;
      }
      else {
        pcVar7 = key->end_;
      }
      uVar14 = uVar13 + 1;
      uVar9 = (long)pcVar7 - (long)pcVar12;
    } while (uVar14 < uVar9);
  }
  local_a8._0_8_ = (char *)0x0;
  local_a8._8_8_ = (char *)0x0;
LAB_001dccad:
  real_key = local_70;
  local_90 = 0;
  local_88._M_local_buf[0] = '\0';
  local_70->begin_ = (char *)local_a8._0_8_;
  local_70->end_ = (char *)local_a8._8_8_;
  local_98._M_p = (pointer)&local_88;
  std::__cxx11::string::operator=((string *)&local_70->key_,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p);
  }
  goto LAB_001dcce1;
  while (uVar10 = uVar10 + 1, uVar10 <= uVar9) {
LAB_001dcdea:
    if (pcVar12[uVar10] == ';') break;
  }
  if (uVar9 <= uVar10) {
    local_a8._0_8_ = pcVar8;
    local_a8._8_8_ = pcVar7;
    if ((long)pcVar7 - (long)pcVar8 == -1) {
      local_a8._8_8_ = pcVar8 + -1;
    }
    goto LAB_001dccad;
  }
  std::vector<cppcms::string_key,_std::allocator<cppcms::string_key>_>::reserve(local_68,6);
  pcVar8 = key->begin_;
  if (pcVar8 == (char *)0x0) {
    pcVar8 = (key->key_)._M_dataplus._M_p;
    local_a8._8_8_ = pcVar8 + (key->key_)._M_string_length;
  }
  else {
    local_a8._8_8_ = key->end_;
  }
  if (uVar14 < (ulong)(local_a8._8_8_ - (long)pcVar8)) {
    local_a8._0_8_ = pcVar8 + uVar14;
    if (uVar10 - uVar14 <= (ulong)(local_a8._8_8_ - local_a8._0_8_)) {
      local_a8._8_8_ = pcVar8 + uVar10;
    }
  }
  else {
    local_a8._0_8_ = (char *)0x0;
    local_a8._8_8_ = (char *)0x0;
  }
  local_90 = 0;
  local_88._M_local_buf[0] = '\0';
  psVar4->begin_ = (char *)local_a8._0_8_;
  psVar4->end_ = (char *)local_a8._8_8_;
  local_98._M_p = (pointer)&local_88;
  std::__cxx11::string::operator=((string *)&psVar4->key_,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p);
  }
  this_00 = local_68;
  do {
    pcVar8 = key->begin_;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (key->key_)._M_dataplus._M_p;
      local_a8._8_8_ = pcVar8 + (key->key_)._M_string_length;
    }
    else {
      local_a8._8_8_ = key->end_;
    }
    uVar14 = uVar10 + 1;
    uVar9 = local_a8._8_8_ - (long)pcVar8;
    if (uVar14 < uVar9) {
      local_a8._0_8_ = pcVar8 + uVar14;
      uVar10 = uVar14;
      do {
        if (pcVar8[uVar10] == ',') break;
        uVar10 = uVar10 + 1;
      } while (uVar10 <= uVar9);
      if (uVar9 <= uVar10) {
        uVar10 = 0xffffffffffffffff;
      }
      if (uVar10 - uVar14 <= (ulong)(local_a8._8_8_ - local_a8._0_8_)) {
        local_a8._8_8_ = pcVar8 + uVar10;
      }
    }
    else {
      local_a8._0_8_ = (char *)0x0;
      local_a8._8_8_ = (char *)0x0;
      uVar10 = 0xffffffffffffffff;
    }
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_98._M_p = (pointer)&local_88;
    std::vector<cppcms::string_key,_std::allocator<cppcms::string_key>_>::
    emplace_back<cppcms::string_key>(this_00,(string_key *)local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p);
    }
    real_key = local_70;
  } while (uVar10 != 0xffffffffffffffff);
LAB_001dcce1:
  local_a8._0_8_ = ".";
  local_a8._8_8_ = "";
  local_90 = 0;
  local_88._M_local_buf[0] = '\0';
  local_98._M_p = (pointer)&local_88;
  bVar5 = string_key::operator==(real_key,(string_key *)local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p);
  }
  if (bVar5) {
LAB_001dcd8e:
    (real_key->key_)._M_string_length = 0;
    real_key->begin_ = (char *)0x0;
    real_key->end_ = (char *)0x0;
    *(real_key->key_)._M_dataplus._M_p = '\0';
  }
  else {
    local_a8._0_8_ = "..";
    local_a8._8_8_ = "";
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_98._M_p = (pointer)&local_88;
    bVar5 = string_key::operator==(real_key,(string_key *)local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p);
    }
    if (bVar5) {
      local_b0 = parent(local_b0);
      goto LAB_001dcd8e;
    }
  }
  this = data::is_app((local_b0->d).ptr_,real_key);
  if (this == (url_mapper *)0x0) {
    return local_b0;
  }
  (real_key->key_)._M_string_length = 0;
  real_key->begin_ = (char *)0x0;
  real_key->end_ = (char *)0x0;
LAB_001dcdc6:
  *(real_key->key_)._M_dataplus._M_p = '\0';
  return this;
}

Assistant:

url_mapper &url_mapper::get_mapper_for_key(string_key const &key,string_key &real_key,std::vector<string_key> &keywords)
	{
		url_mapper *mapper = this;
		size_t pos = 0;
		if(key.empty()) {
			real_key.clear();
			return *mapper;
		}
		if(key[0]=='/') {
			mapper = &mapper->topmost();
			pos = 1;
		}
		for(;;) {
			size_t end = key.find('/',pos);
			if(end == std::string::npos) {
				size_t separator = key.find(';',pos);
				if(separator == std::string::npos) {
					real_key = key.unowned_substr(pos);
				}
				else {
					keywords.reserve(6);
					real_key = key.unowned_substr(pos,separator - pos);
					pos = separator + 1;
					for(;;){
						end = key.find(',',pos);
						size_t size = end - pos;
						keywords.push_back(key.unowned_substr(pos,size));
						if(end == std::string::npos)
							break;
						pos = end + 1;
					}
					
				}
				if(real_key == ".")
					real_key.clear();
				else if(real_key == "..") {
					mapper = &mapper->parent();
					real_key.clear();
				}
					
				url_mapper *tmp = mapper->d->is_app(real_key);
				if(tmp) { 
					// empty special key
					real_key.clear();
					return *tmp;
				}
				return *mapper;
			}
			size_t chunk_size = end - pos;
			string_key subapp = key.unowned_substr(pos,chunk_size);
			if(subapp == ".")
				; // Just continue where we are
			else if(subapp == "..") {
				mapper = &mapper->parent();
			}
			else {
				mapper = &mapper->d->child(subapp,key);
			}
			pos = end + 1;
		}
	}